

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerCheckpoint(Pager *pPager,sqlite3 *db,int eMode,int *pnLog,int *pnCkpt)

{
  _func_int_void_ptr *local_58;
  int local_3c;
  int rc;
  int *pnCkpt_local;
  int *pnLog_local;
  int eMode_local;
  sqlite3 *db_local;
  Pager *pPager_local;
  
  local_3c = 0;
  if ((pPager->pWal == (Wal *)0x0) && (pPager->journalMode == '\x05')) {
    sqlite3_exec(db,"PRAGMA table_list",(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
  }
  if (pPager->pWal != (Wal *)0x0) {
    if (eMode == 0) {
      local_58 = (_func_int_void_ptr *)0x0;
    }
    else {
      local_58 = pPager->xBusyHandler;
    }
    local_3c = sqlite3WalCheckpoint
                         (pPager->pWal,db,eMode,local_58,pPager->pBusyHandlerArg,
                          (uint)pPager->walSyncFlags,(int)pPager->pageSize,(u8 *)pPager->pTmpSpace,
                          pnLog,pnCkpt);
  }
  return local_3c;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerCheckpoint(
  Pager *pPager,                  /* Checkpoint on this pager */
  sqlite3 *db,                    /* Db handle used to check for interrupts */
  int eMode,                      /* Type of checkpoint */
  int *pnLog,                     /* OUT: Final number of frames in log */
  int *pnCkpt                     /* OUT: Final number of checkpointed frames */
){
  int rc = SQLITE_OK;
  if( pPager->pWal==0 && pPager->journalMode==PAGER_JOURNALMODE_WAL ){
    /* This only happens when a database file is zero bytes in size opened and
    ** then "PRAGMA journal_mode=WAL" is run and then sqlite3_wal_checkpoint()
    ** is invoked without any intervening transactions.  We need to start
    ** a transaction to initialize pWal.  The PRAGMA table_list statement is
    ** used for this since it starts transactions on every database file,
    ** including all ATTACHed databases.  This seems expensive for a single
    ** sqlite3_wal_checkpoint() call, but it happens very rarely.
    ** https://sqlite.org/forum/forumpost/fd0f19d229156939
    */
    sqlite3_exec(db, "PRAGMA table_list",0,0,0);
  }
  if( pPager->pWal ){
    rc = sqlite3WalCheckpoint(pPager->pWal, db, eMode,
        (eMode==SQLITE_CHECKPOINT_PASSIVE ? 0 : pPager->xBusyHandler),
        pPager->pBusyHandlerArg,
        pPager->walSyncFlags, pPager->pageSize, (u8 *)pPager->pTmpSpace,
        pnLog, pnCkpt
    );
  }
  return rc;
}